

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::Block::Block(Block *this)

{
  (this->label)._M_dataplus._M_p = (pointer)&(this->label).field_2;
  (this->label)._M_string_length = 0;
  (this->label).field_2._M_local_buf[0] = '\0';
  (this->decl).has_func_type = false;
  Var::Var(&(this->decl).type_var);
  (this->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->decl).sig.param_type_names._M_h._M_buckets =
       &(this->decl).sig.param_type_names._M_h._M_single_bucket;
  (this->decl).sig.param_type_names._M_h._M_bucket_count = 1;
  (this->decl).sig.param_type_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->decl).sig.param_type_names._M_h._M_element_count = 0;
  (this->decl).sig.param_type_names._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->decl).sig.param_type_names._M_h._M_rehash_policy._M_next_resize = 0;
  (this->decl).sig.param_type_names._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->decl).sig.result_type_names._M_h._M_buckets =
       &(this->decl).sig.result_type_names._M_h._M_single_bucket;
  (this->decl).sig.result_type_names._M_h._M_bucket_count = 1;
  (this->decl).sig.result_type_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->decl).sig.result_type_names._M_h._M_element_count = 0;
  (this->decl).sig.result_type_names._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->decl).sig.result_type_names._M_h._M_rehash_policy._M_next_resize = 0;
  (this->decl).sig.result_type_names._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->exprs).first_ = (Expr *)0x0;
  (this->exprs).last_ = (Expr *)0x0;
  (this->exprs).size_ = 0;
  (this->end_loc).filename._M_len = 0;
  (this->end_loc).filename._M_str = (char *)0x0;
  (this->end_loc).field_1.field_1.offset = 0;
  (this->end_loc).field_1.field_0.last_column = 0;
  return;
}

Assistant:

Block() = default;